

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetItem
               (Var instance,RecyclableObject *propertyObject,uint32 index,Var *value,
               ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  RecyclableObject *pRVar7;
  uint unaff_R13D;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (((propertyObject->type).ptr)->typeId == TypeIds_Null) goto LAB_00ab2c93;
    iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x26])
                      (propertyObject,instance,(ulong)index,value,requestContext);
    if (iVar4 == 0) {
      BVar5 = RecyclableObject::SkipsPrototype(propertyObject);
      iVar4 = 3;
      if (BVar5 == 0) {
        pTVar1 = (propertyObject->type).ptr;
        if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00ab2c6e:
          propertyObject = (pTVar1->prototype).ptr;
        }
        else {
          if (pTVar1->typeId == TypeIds_Proxy) {
            if ((pTVar1->prototype).ptr !=
                (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                   ptr)->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                nullValue.ptr) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x57a,
                                          "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                          ,
                                          "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                         );
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar6 = 0;
            }
            goto LAB_00ab2c6e;
          }
          iVar4 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[6])(propertyObject);
          propertyObject = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
        }
        iVar4 = 0;
      }
    }
    else {
      unaff_R13D = (uint)(iVar4 == 1);
      iVar4 = 1;
    }
  } while (iVar4 == 0);
  if (iVar4 == 3) {
LAB_00ab2c93:
    pRVar7 = ScriptContext::GetMissingItemResult(requestContext);
    *value = pRVar7;
    unaff_R13D = 0;
  }
  return unaff_R13D;
}

Assistant:

BOOL JavascriptOperators::GetItem(Var instance, RecyclableObject* propertyObject, uint32 index, Var* value, ScriptContext* requestContext)
    {
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->GetItemQuery(instance, index, value, requestContext)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        *value = requestContext->GetMissingItemResult();
        return false;
    }